

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

void Rml::Parse::Additive(DataParser *parser)

{
  char cVar1;
  Variant VStack_38;
  
  Term(parser);
  if (parser->reached_end == false) {
    do {
      cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
      if (cVar1 == '-') {
        DataParser::Match(parser,'-',true);
        DataParser::Push(parser);
        Term(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_38);
        DataParser::Emit(parser,Subtract,&VStack_38);
      }
      else {
        if (cVar1 != '+') {
          return;
        }
        DataParser::Match(parser,'+',true);
        DataParser::Push(parser);
        Term(parser);
        DataParser::Pop(parser,L);
        Variant::Variant(&VStack_38);
        DataParser::Emit(parser,Add,&VStack_38);
      }
      Variant::~Variant(&VStack_38);
    } while (parser->reached_end != true);
  }
  return;
}

Assistant:

static void Additive(DataParser& parser)
	{
		Term(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '+': Add(parser); break;
			case '-': Subtract(parser); break;
			default: looping = false;
			}
		}
	}